

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

Mat __thiscall Mat::GetCol(Mat *this,int iCol)

{
  size_t __n;
  uint uVar1;
  uint uVar2;
  double *__s;
  double *pdVar3;
  int in_EDX;
  double *extraout_RDX;
  double *extraout_RDX_00;
  double *pdVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  uint *puVar6;
  Mat MVar7;
  
  puVar6 = (uint *)CONCAT44(in_register_00000034,iCol);
  uVar1 = *puVar6;
  this->n_rows_ = uVar1;
  this->n_cols_ = 1;
  __n = (ulong)uVar1 * 8;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (int)uVar1) {
    uVar5 = __n;
  }
  __s = (double *)operator_new__(uVar5);
  this->v_ = __s;
  pdVar4 = extraout_RDX;
  if (0 < (int)uVar1) {
    uVar5 = 0;
    memset(__s,0,__n);
    uVar2 = puVar6[1];
    pdVar3 = (double *)((long)in_EDX * 8 + *(long *)(puVar6 + 2));
    do {
      __s[uVar5] = *pdVar3;
      uVar5 = uVar5 + 1;
      pdVar3 = pdVar3 + (int)uVar2;
      pdVar4 = extraout_RDX_00;
    } while (uVar1 != uVar5);
  }
  MVar7.v_ = pdVar4;
  MVar7._0_8_ = this;
  return MVar7;
}

Assistant:

Mat Mat::GetCol(int iCol)
{
	Mat Col(n_rows_);
	for ( int i = 0;  i< n_rows_; i++)
		Col.v_[i] = v_[n_cols_ * i+iCol];
	return Col;
}